

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Utf16ComputeByteLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint *data;
  long lVar5;
  bool bVar6;
  
  data = (uint *)chunks->data;
  lVar3 = 2;
  do {
    bVar6 = length == 0;
    length = length - 1;
    if (bVar6) {
      return 0;
    }
    CVar1 = chunks->format;
    lVar5 = lVar3;
    if (CVar1 == COL_UTF16) {
      uVar4 = Col_Utf16Get((Col_Char2 *)data);
LAB_00109375:
      if (0xd7ff < uVar4) {
        if (uVar4 < 0xe000) {
LAB_00109386:
          lVar5 = 0;
        }
        else if (0xffff < uVar4) {
          lVar5 = (ulong)(uVar4 < 0x110000) << 2;
        }
      }
    }
    else {
      if (CVar1 == COL_UCS2) {
        uVar4 = (uint)(ushort)*data;
        goto LAB_00109375;
      }
      if (CVar1 == COL_UCS4) {
        uVar4 = *data;
        goto LAB_00109375;
      }
      if (CVar1 == COL_UTF8) {
        uVar4 = Col_Utf8Get((Col_Char1 *)data);
        goto LAB_00109375;
      }
      if (CVar1 != COL_UCS1) goto LAB_00109386;
    }
    lVar2 = *clientData;
    *(long *)clientData = lVar5 + lVar2;
    if (0xfda < (ulong)(lVar5 + lVar2)) {
      return 1;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UCS1) {
      data = (uint *)((long)data + 1);
    }
    else if (CVar1 == COL_UCS2) {
      data = (uint *)((long)data + 2);
    }
    else if (CVar1 == COL_UCS4) {
      data = data + 1;
    }
    else if (CVar1 == COL_UTF8) {
      data = (uint *)Col_Utf8Next((Col_Char1 *)data);
    }
    else if (CVar1 == COL_UTF16) {
      data = (uint *)Col_Utf16Next((Col_Char2 *)data);
    }
    else {
      data = (uint *)0x0;
    }
  } while( true );
}

Assistant:

static int
Utf16ComputeByteLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *byteLengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        *byteLengthPtr += COL_UTF16_WIDTH(c) * CHAR_WIDTH(COL_UTF16);

        /*!
         * @retval 1 stops traversal if byte length exceeds
         * #UTFSTR_MAX_BYTELENGTH.
         */

        if (*byteLengthPtr > UTFSTR_MAX_BYTELENGTH) return 1;
    }

    /*!
     * @retval 0 will continue traversal.
     */

    return 0;
}